

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::Stmt> __thiscall
kratos::Generator::wire_ports
          (Generator *this,shared_ptr<kratos::Port> *port1,shared_ptr<kratos::Port> *port2)

{
  allocator<const_kratos::IRNode_*> *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *port1_00;
  element_type *port2_00;
  VarException *this_01;
  element_type *peVar1;
  __shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::Stmt> sVar2;
  format_args args;
  string_view format_str;
  shared_ptr<kratos::Stmt> local_1e0;
  shared_ptr<kratos::Var> local_1d0;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [24];
  shared_ptr<kratos::AssignStmt> stmt;
  element_type *local_178;
  element_type *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_168;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_158;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_140;
  shared_ptr<kratos::VarConcat> local_110 [2];
  string local_f0;
  type_conflict3 *local_d0;
  type_conflict3 *no_error;
  type_conflict3 *dir;
  __node_base local_b8;
  shared_ptr<kratos::Port> *port2_local;
  shared_ptr<kratos::Port> *port1_local;
  Generator *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_98;
  _Prime_rehash_policy local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  shared_ptr<kratos::VarConcat> *local_48;
  pointer local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  undefined8 local_10;
  
  local_b8._M_nxt = (_Hash_node_base *)in_RCX;
  port2_local = port2;
  port1_local = port1;
  this_local = this;
  port1_00 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                       (&port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>);
  port2_00 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_b8._M_nxt);
  dir._6_2_ = correct_port_direction(port1_00,port2_00,(Generator *)port1);
  no_error = std::get<0ul,bool,bool>((pair<bool,_bool> *)((long)&dir + 6));
  local_d0 = std::get<1ul,bool,bool>((pair<bool,_bool> *)((long)&dir + 6));
  if ((*local_d0 & 1U) == 0) {
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
         = 1;
    this_01 = (VarException *)__cxa_allocate_exception(0x10);
    peVar1 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)port2_local);
    (*(peVar1->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_110);
    peVar1 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b8._M_nxt);
    (*(peVar1->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_140);
    local_38 = &local_f0;
    local_40 = (pointer)0x42aa88;
    local_48 = local_110;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_140;
    fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[83],char>
              (&local_78,
               (v7 *)
               "Cannot wire {0} and {1}. Please make sure they belong to the same module or parent",
               (char (*) [83])local_48,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>((char *)local_40);
    local_28 = &local_98;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_98.field_1.values_;
    format_str.size_ = local_98.desc_;
    format_str.data_ = (char *)local_88._M_next_resize;
    fmt::v7::detail::vformat_abi_cxx11_(&local_f0,(detail *)local_88._0_8_,format_str,args);
    local_178 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                          (&port2_local->
                            super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>);
    local_170 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_b8._M_nxt
                          );
    local_168._M_allocated_capacity = (size_type)&local_178;
    local_168._8_8_ = 2;
    this_00 = (allocator<const_kratos::IRNode_*> *)
              ((long)&stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7);
    std::allocator<const_kratos::IRNode_*>::allocator(this_00);
    __l._M_len = local_168._8_8_;
    __l._M_array = (iterator)local_168._M_allocated_capacity;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_158,__l,this_00);
    VarException::VarException(this_01,&local_f0,&local_158);
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
         = 0;
    __cxa_throw(this_01,&VarException::typeinfo,VarException::~VarException);
  }
  std::shared_ptr<kratos::AssignStmt>::shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)(local_1a0 + 0x10));
  if ((*no_error & 1U) == 0) {
    peVar1 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b8._M_nxt);
    std::shared_ptr<kratos::Var>::shared_ptr<kratos::Port,void>(&local_1d0,port2_local);
    Var::assign((Var *)local_1c0,(shared_ptr<kratos::Var> *)peVar1);
    std::shared_ptr<kratos::AssignStmt>::operator=
              ((shared_ptr<kratos::AssignStmt> *)(local_1a0 + 0x10),
               (shared_ptr<kratos::AssignStmt> *)local_1c0);
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_1c0);
    std::shared_ptr<kratos::Var>::~shared_ptr(&local_1d0);
  }
  else {
    peVar1 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)port2_local);
    std::shared_ptr<kratos::Var>::shared_ptr<kratos::Port,void>
              ((shared_ptr<kratos::Var> *)(local_1c0 + 0x10),
               (shared_ptr<kratos::Port> *)local_b8._M_nxt);
    Var::assign((Var *)local_1a0,(shared_ptr<kratos::Var> *)peVar1);
    std::shared_ptr<kratos::AssignStmt>::operator=
              ((shared_ptr<kratos::AssignStmt> *)(local_1a0 + 0x10),
               (shared_ptr<kratos::AssignStmt> *)local_1a0);
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_1a0);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)(local_1c0 + 0x10));
  }
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_1e0,(shared_ptr<kratos::AssignStmt> *)(local_1a0 + 0x10));
  add_stmt((Generator *)port1,&local_1e0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_1e0);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::AssignStmt> *)(local_1a0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)(local_1a0 + 0x10));
  sVar2.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Stmt>)
         sVar2.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Stmt> Generator::wire_ports(std::shared_ptr<Port> &port1,
                                            std::shared_ptr<Port> &port2) {
    auto [dir, no_error] = correct_port_direction(port1.get(), port2.get(), this);
    if (!no_error) {
        throw VarException(
            ::format("Cannot wire {0} and {1}. Please make sure they belong to the same module "
                     "or parent",
                     port1->to_string(), port2->to_string()),
            {port1.get(), port2.get()});
    }
    std::shared_ptr<AssignStmt> stmt;
    if (dir)
        stmt = port1->assign(port2);
    else
        stmt = port2->assign(port1);
    add_stmt(stmt);
    return stmt;
}